

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O0

string * __thiscall
ApprovalTests::ApprovalTestNamer::getTestName_abi_cxx11_(ApprovalTestNamer *this)

{
  TestName *this_00;
  size_type sVar1;
  reference pvVar2;
  TestName *in_RDI;
  size_t i;
  TestName test;
  stringstream ext;
  TestName *in_stack_fffffffffffffdb0;
  string local_228 [16];
  string *in_stack_fffffffffffffde8;
  ulong local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0 [3];
  stringstream local_198 [16];
  ostream local_188;
  
  ::std::__cxx11::stringstream::stringstream(local_198);
  this_00 = getCurrentTest();
  TestName::TestName(this_00,in_RDI);
  local_208 = 0;
  while( true ) {
    sVar1 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_1f0);
    if (sVar1 <= local_208) break;
    if (local_208 != 0) {
      ::std::operator<<(&local_188,".");
    }
    in_stack_fffffffffffffdb0 = (TestName *)&local_188;
    pvVar2 = ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_1f0,local_208);
    ::std::operator<<((ostream *)in_stack_fffffffffffffdb0,(string *)pvVar2);
    local_208 = local_208 + 1;
  }
  ::std::__cxx11::stringstream::str();
  convertToFileName(in_stack_fffffffffffffde8);
  ::std::__cxx11::string::~string(local_228);
  TestName::~TestName(in_stack_fffffffffffffdb0);
  ::std::__cxx11::stringstream::~stringstream(local_198);
  return (string *)in_RDI;
}

Assistant:

std::string ApprovalTestNamer::getTestName() const
    {
        std::stringstream ext;
        auto test = getCurrentTest();
        for (size_t i = 0; i < test.sections.size(); i++)
        {
            if (0 < i)
            {
                ext << ".";
            }
            ext << test.sections[i];
        }

        return convertToFileName(ext.str());
    }